

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::generateFragShaderOutputDecl
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *outLocationMap,string *outputPrefix)

{
  bool bVar1;
  deBool dVar2;
  DataType DVar3;
  int iVar4;
  int vecSize_00;
  int iVar5;
  size_type sVar6;
  const_reference key;
  mapped_type *pmVar7;
  InternalError *this;
  ostream *poVar8;
  DataType local_204;
  DataType local_1ec;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  int local_15c;
  undefined1 local_158 [4];
  int vecNdx;
  VarType uintType_1;
  DataType uintBasicType_1;
  int numVecs;
  int vecSize_2;
  VarType intType;
  DataType intBasicType;
  int vecSize_1;
  VarType uintType;
  DataType uintBasicType;
  int vecSize;
  Layout local_dc;
  undefined1 local_c8 [8];
  VariableDeclaration decl;
  string outVarName;
  int location;
  Symbol *output;
  int outNdx;
  string *outputPrefix_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *outLocationMap_local;
  bool useIntOutputs_local;
  ShaderSpec *shaderSpec_local;
  ostream *src_local;
  
  output._4_4_ = 0;
  do {
    sVar6 = std::
            vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ::size(&shaderSpec->outputs);
    if ((int)sVar6 <= output._4_4_) {
      return;
    }
    key = std::
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ::operator[](&shaderSpec->outputs,(long)output._4_4_);
    pmVar7 = de::
             lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                       (outLocationMap,&key->name);
    iVar4 = *pmVar7;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&decl.name.field_2 + 8),outputPrefix,&key->name);
    glu::Layout::Layout(&local_dc,iVar4,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_c8,&key->varType,
               (string *)((long)&decl.name.field_2 + 8),STORAGE_OUT,INTERPOLATION_LAST,&local_dc,0);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (bVar1 = glu::VarType::isBasicType(&key->varType), !bVar1)) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,(char *)0x0,"output.varType.isBasicType()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                   ,0x135);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (useIntOutputs) {
      DVar3 = glu::VarType::getBasicType(&key->varType);
      bVar1 = glu::isDataTypeFloatOrVec(DVar3);
      if (!bVar1) goto LAB_00cdaa58;
      DVar3 = glu::VarType::getBasicType(&key->varType);
      iVar4 = glu::getDataTypeScalarSize(DVar3);
      if (iVar4 < 2) {
        local_1ec = TYPE_UINT;
      }
      else {
        local_1ec = glu::getDataTypeUintVec(iVar4);
      }
      uintType.m_data._12_4_ = local_1ec;
      glu::VarType::VarType((VarType *)&intBasicType,local_1ec,PRECISION_HIGHP);
      glu::VarType::operator=((VarType *)&decl.storage,(VarType *)&intBasicType);
      poVar8 = glu::operator<<(src,(VariableDeclaration *)local_c8);
      std::operator<<(poVar8,";\n");
      glu::VarType::~VarType((VarType *)&intBasicType);
    }
    else {
LAB_00cdaa58:
      DVar3 = glu::VarType::getBasicType(&key->varType);
      bVar1 = glu::isDataTypeBoolOrBVec(DVar3);
      if (bVar1) {
        DVar3 = glu::VarType::getBasicType(&key->varType);
        intType.m_data._12_4_ = glu::getDataTypeScalarSize(DVar3);
        if ((int)intType.m_data._12_4_ < 2) {
          local_204 = TYPE_INT;
        }
        else {
          local_204 = glu::getDataTypeIntVec(intType.m_data._12_4_);
        }
        intType.m_data.array.size = local_204;
        glu::VarType::VarType((VarType *)&numVecs,local_204,PRECISION_HIGHP);
        glu::VarType::operator=((VarType *)&decl.storage,(VarType *)&numVecs);
        poVar8 = glu::operator<<(src,(VariableDeclaration *)local_c8);
        std::operator<<(poVar8,";\n");
        glu::VarType::~VarType((VarType *)&numVecs);
      }
      else {
        DVar3 = glu::VarType::getBasicType(&key->varType);
        bVar1 = glu::isDataTypeMatrix(DVar3);
        if (bVar1) {
          DVar3 = glu::VarType::getBasicType(&key->varType);
          vecSize_00 = glu::getDataTypeMatrixNumRows(DVar3);
          DVar3 = glu::VarType::getBasicType(&key->varType);
          iVar5 = glu::getDataTypeMatrixNumColumns(DVar3);
          uintType_1.m_data._12_4_ = glu::getDataTypeUintVec(vecSize_00);
          glu::VarType::VarType((VarType *)local_158,uintType_1.m_data._12_4_,PRECISION_HIGHP);
          glu::VarType::operator=((VarType *)&decl.storage,(VarType *)local_158);
          for (local_15c = 0; local_15c < iVar5; local_15c = local_15c + 1) {
            std::operator+(&local_1a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&decl.name.field_2 + 8),"_");
            de::toString<int>(&local_1c0,&local_15c);
            std::operator+(&local_180,&local_1a0,&local_1c0);
            std::__cxx11::string::operator=
                      ((string *)&decl.memoryAccessQualifierBits,(string *)&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1a0);
            local_c8._0_4_ = iVar4 + local_15c;
            poVar8 = glu::operator<<(src,(VariableDeclaration *)local_c8);
            std::operator<<(poVar8,";\n");
          }
          glu::VarType::~VarType((VarType *)local_158);
        }
        else {
          poVar8 = glu::operator<<(src,(VariableDeclaration *)local_c8);
          std::operator<<(poVar8,";\n");
        }
      }
    }
    glu::VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_c8);
    std::__cxx11::string::~string((string *)(decl.name.field_2._M_local_buf + 8));
    output._4_4_ = output._4_4_ + 1;
  } while( true );
}

Assistant:

static void generateFragShaderOutputDecl (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));

	for (int outNdx = 0; outNdx < (int)shaderSpec.outputs.size(); ++outNdx)
	{
		const Symbol&				output		= shaderSpec.outputs[outNdx];
		const int					location	= de::lookup(outLocationMap, output.name);
		const std::string			outVarName	= outputPrefix + output.name;
		glu::VariableDeclaration	decl		(output.varType, outVarName, glu::STORAGE_OUT, glu::INTERPOLATION_LAST, glu::Layout(location));

		TCU_CHECK_INTERNAL(output.varType.isBasicType());

		if (useIntOutputs && glu::isDataTypeFloatOrVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	intBasicType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType	intType			(intBasicType, glu::PRECISION_HIGHP);

			decl.varType = intType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeMatrix(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeMatrixNumRows(output.varType.getBasicType());
			const int			numVecs			= glu::getDataTypeMatrixNumColumns(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= glu::getDataTypeUintVec(vecSize);
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
			{
				decl.name				= outVarName + "_" + de::toString(vecNdx);
				decl.layout.location	= location + vecNdx;
				src << decl << ";\n";
			}
		}
		else
			src << decl << ";\n";
	}
}